

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildValue::BuildValue
          (BuildValue *this,Kind kind,FileInfo directoryInfo,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringList local_30;
  
  outputInfos.Length = 1;
  outputInfos.Data = &directoryInfo;
  BuildValue(this,kind,outputInfos,(CommandSignature)0x0);
  if ((this->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    basic::StringList::StringList<std::__cxx11::string>(&local_30,values);
    basic::StringList::operator=(&this->stringValues,&local_30);
    basic::StringList::~StringList(&local_30);
    return;
  }
  __assert_fail("kindHasStringList()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0xac,
                "llbuild::buildsystem::BuildValue::BuildValue(Kind, FileInfo, ArrayRef<std::string>)"
               );
}

Assistant:

BuildValue(Kind kind, FileInfo directoryInfo, ArrayRef<std::string> values)
      : BuildValue(kind, directoryInfo)
  {
    assert(kindHasStringList());

    stringValues = basic::StringList(values);
  }